

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_thread_pool.h
# Opt level: O3

void __thiscall simple_thread_pool::TaskHandle::reschedule(TaskHandle *this,int64_t new_interval_us)

{
  int iVar1;
  rep rVar2;
  
  rVar2 = std::chrono::_V2::system_clock::now();
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->tRegisteredLock);
  if (iVar1 == 0) {
    (this->tRegistered).__d.__r = rVar2;
    if (-1 < new_interval_us) {
      this->intervalUs = new_interval_us;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->tRegisteredLock);
    (*this->mgr->_vptr_ThreadPoolMgrBase[7])();
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void reschedule(int64_t new_interval_us = -1) {
        auto cur = std::chrono::system_clock::now();
        {   std::lock_guard<std::mutex> l(tRegisteredLock);
            tRegistered = cur;
            if (new_interval_us >= 0) {
                intervalUs = new_interval_us;
            }
        }
        mgr->checkThreadAndInvoke();
    }